

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

int __thiscall QFile::rename(QFile *this,char *__old,char *__new)

{
  QString *filePath;
  QFilePrivate *this_00;
  long lVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  int *piVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  FileError FVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src_00;
  QFile *__new_00;
  char *__filename;
  QFileSystemEntry *__old_00;
  undefined7 uVar14;
  QString *pQVar13;
  int iVar15;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QStringView lhs;
  QSystemError error2;
  QSystemError error;
  QFileSystemEntry tmp;
  QFileSystemEntry src;
  QString local_288;
  QString local_270;
  QString local_258;
  QString local_240;
  type local_228;
  QString local_208;
  QString local_1f0;
  QString local_1d8;
  QString local_1c0;
  QSystemError local_1a8;
  QSystemError local_1a0;
  QTemporaryFileName local_198;
  QByteArray local_168;
  QByteArray local_148;
  QFileSystemEntry local_130;
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  QFileSystemEntry local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  __old_00 = &local_78;
  __new_00 = this;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])();
  if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d == 0) {
      __new_00 = (QFile *)0x2;
      __old_00 = (QFileSystemEntry *)local_78.m_filePath.d.d;
      QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_78.m_filePath.d.size == 0) {
    rename((char *)__old_00,(char *)__new_00);
  }
  else {
    lVar1 = (this_00->fileName).d.size;
    if ((lVar1 == *(long *)(__old + 0x10)) &&
       (rhs.m_data = *(storage_type_conflict **)(__old + 8), rhs.m_size = *(long *)(__old + 0x10),
       lhs.m_data = (this_00->fileName).d.ptr, lhs.m_size = lVar1,
       bVar8 = QtPrivate::equalStrings(lhs,rhs), bVar8)) {
      QMetaObject::tr(&local_78.m_filePath,&staticMetaObject,"Destination file is the same file.",
                      (char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&local_78.m_filePath);
    }
    else {
      iVar10 = (*((this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d)->
                 _vptr_QObjectData[7])();
      uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0xb0))
                         ((long *)CONCAT44(extraout_var,iVar10),0xff00000);
      if ((uVar11 >> 0x16 & 1) != 0) {
        local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::QFileSystemEntry(&local_78,(QString *)__old);
        QFileSystemEngine::id(&local_148,&local_78);
        if (&(local_78.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
          ._M_i = ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
          }
        }
        filePath = &this_00->fileName;
        bVar8 = QByteArray::isNull(&local_148);
        if (bVar8) {
          QFileDevice::unsetError(&this->super_QFileDevice);
          (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
          FVar12 = QFileDevice::error(&this->super_QFileDevice);
          if (FVar12 == NoError) {
            iVar10 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate.
                       super_QObjectPrivate.super_QObjectData._vptr_QObjectData[7])(this_00);
            cVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x60))
                              ((long *)CONCAT44(extraout_var_00,iVar10),__old);
            uVar14 = (undefined7)((ulong)filePath >> 8);
            if (cVar9 != '\0') {
              QFileDevice::unsetError(&this->super_QFileDevice);
              _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                   (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                   super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                   .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
              (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0xf0))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         __old);
              QString::operator=(filePath,(QString *)__old);
              uVar11 = (uint)CONCAT71(uVar14,1);
              goto LAB_00235f75;
            }
            iVar10 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])
                               (this);
            if ((char)iVar10 == '\0') {
              __filename = __old;
              iVar10 = QFilePrivate::copy(this_00,(EVP_PKEY_CTX *)__old,src_00);
              if ((char)iVar10 != '\0') {
                iVar10 = remove(this,__filename);
                if ((char)iVar10 == '\0') {
                  QMetaObject::tr((QString *)local_b8,&staticMetaObject,
                                  "Cannot remove source file: %1",(char *)0x0,-1);
                  QIODevice::errorString((QString *)local_f8,(QIODevice *)this);
                  a_01.m_size = local_f8._16_8_ | 0x8000000000000000;
                  a_01.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_f8._8_8_;
                  QString::arg_impl(&local_78.m_filePath,(QString *)local_b8,a_01,0,(QChar)0x20);
                  QFileDevicePrivate::setError
                            ((QFileDevicePrivate *)this_00,RenameError,&local_78.m_filePath);
                  if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
                    }
                  }
                  local_78.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_78.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  QFile((QFile *)&local_78,(QString *)__old);
                  QFileDevice::setPermissions((QFileDevice *)&local_78,(Permissions)0x600);
                  remove(__old);
                  ~QFile((QFile *)&local_78);
                  goto LAB_00235d7a;
                }
                _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                     (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                     super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                     .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
                (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                      _M_head_impl + 0xf0))
                          (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                           __old);
                QFileDevice::unsetError(&this->super_QFileDevice);
                uVar11 = (uint)CONCAT71(uVar14,1);
                setFileName(this,(QString *)__old);
                goto LAB_00235f75;
              }
              QIODevice::errorString(&local_78.m_filePath,(QIODevice *)this);
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)this_00,RenameError,&local_78.m_filePath);
            }
            else {
              QMetaObject::tr(&local_78.m_filePath,&staticMetaObject,
                              "Will not rename sequential file using block copy",(char *)0x0,-1);
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)this_00,RenameError,&local_78.m_filePath);
            }
            if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
LAB_00235d7a:
          uVar11 = 0;
        }
        else {
          local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_168.d.d._0_4_ = 0xaaaaaaaa;
          local_168.d.d._4_4_ = 0xaaaaaaaa;
          local_168.d.ptr._0_4_ = 0xaaaaaaaa;
          local_168.d.ptr._4_4_ = 0xaaaaaaaa;
          _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
               (this_00->super_QFileDevicePrivate).fileEngine._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
          if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
              (QAbstractFileEngine *)0x0) {
            QFileSystemEntry::QFileSystemEntry(&local_78,filePath);
            QFileSystemEngine::id(&local_168,&local_78);
            if (&(local_78.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_78.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_78.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0xc0))
                      (&local_168,
                       _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
          }
          if ((local_168.d.size == local_148.d.size) &&
             ((((undefined1 *)local_168.d.size == (undefined1 *)0x0 ||
               (iVar10 = bcmp((void *)CONCAT44(local_168.d.ptr._4_4_,local_168.d.ptr._0_4_),
                              local_148.d.ptr,local_168.d.size), iVar10 == 0)) &&
              (iVar10 = QString::compare(filePath,(QString *)__old,CaseInsensitive), iVar10 == 0))))
          {
            local_198.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_198.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            local_198.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_198.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_198.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QTemporaryFileName::QTemporaryFileName(&local_198,filePath);
            local_b8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_b8,filePath);
            local_1a0.errorCode = 0;
            local_1a0.errorScope = NoError;
            iVar10 = 0x10;
            pQVar13 = filePath;
            do {
              local_f8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTemporaryFileName::generateNext((NativePath *)&local_130,&local_198);
              QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_f8,&local_130);
              if (&(local_130.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_130.m_filePath.d.d)->super_QArrayData,1,0x10);
                }
              }
              bVar8 = QFileSystemEngine::renameFile
                                ((QFileSystemEntry *)local_b8,(QFileSystemEntry *)local_f8,
                                 &local_1a0);
              iVar15 = 4;
              if (bVar8) {
                QFileSystemEntry::QFileSystemEntry(&local_130,(QString *)__old);
                bVar8 = QFileSystemEngine::renameFile
                                  ((QFileSystemEntry *)local_f8,&local_130,&local_1a0);
                piVar3 = (int *)CONCAT62(local_130.m_nativeFilePath.d.d._2_6_,
                                         local_130.m_nativeFilePath.d.d._0_2_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)
                               CONCAT62(local_130.m_nativeFilePath.d.d._2_6_,
                                        local_130.m_nativeFilePath.d.d._0_2_),1,0x10);
                  }
                }
                if (&(local_130.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_130.m_filePath.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (bVar8) {
                  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                       (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                       .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
                  (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                        _M_head_impl + 0xf0))
                            (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                             __old);
                  QString::operator=(filePath,(QString *)__old);
                  pQVar13 = (QString *)CONCAT71((int7)((ulong)pQVar13 >> 8),1);
                  iVar15 = 1;
                }
                else {
                  local_1a8.errorCode = 0;
                  local_1a8.errorScope = NoError;
                  bVar8 = QFileSystemEngine::renameFile
                                    ((QFileSystemEntry *)local_f8,(QFileSystemEntry *)local_b8,
                                     &local_1a8);
                  iVar15 = 2;
                  if (!bVar8) {
                    QMetaObject::tr(&local_1f0,&staticMetaObject,"Error while renaming: %1",
                                    (char *)0x0,-1);
                    QSystemError::string(&local_208,local_1a0.errorScope,local_1a0.errorCode);
                    a.m_size = local_208.d.size | 0x8000000000000000;
                    a.field_0.m_data_utf16 = local_208.d.ptr;
                    QString::arg_impl(&local_1d8,&local_1f0,a,0,(QChar)0x20);
                    qVar5 = local_1d8.d.size;
                    pcVar7 = local_1d8.d.ptr;
                    pDVar6 = local_1d8.d.d;
                    local_1d8.d.d = (Data *)0x0;
                    local_1d8.d.ptr = (char16_t *)0x0;
                    local_1d8.d.size = 0;
                    QMetaObject::tr(&local_240,&staticMetaObject,"Unable to restore from %1: %2",
                                    (char *)0x0,-1);
                    QFileSystemEntry::filePath(&local_270,(QFileSystemEntry *)local_f8);
                    QDir::toNativeSeparators(&local_270);
                    QSystemError::string(&local_288,local_1a8.errorScope,local_1a8.errorCode);
                    QString::arg<QString,QString>(&local_228,&local_240,&local_258,&local_288);
                    qVar4 = local_228.d.size;
                    local_130.m_nativeFilePath.d.size = (qsizetype)local_228.d.ptr;
                    local_130.m_nativeFilePath.d.ptr = (char *)local_228.d.d;
                    local_130.m_filePath.d.d = pDVar6;
                    local_130.m_filePath.d.ptr = pcVar7;
                    local_130.m_filePath.d.size = qVar5;
                    local_130.m_nativeFilePath.d.d._0_2_ = 10;
                    local_228.d.d = (Data *)0x0;
                    local_228.d.ptr = (char16_t *)0x0;
                    local_228.d.size = 0;
                    qVar5 = local_228.d.size;
                    local_228.d.size._0_2_ = (undefined2)qVar4;
                    local_228.d.size._2_2_ = SUB82(qVar4,2);
                    local_228.d.size._4_2_ = SUB82(qVar4,4);
                    local_228.d.size._6_2_ = SUB82(qVar4,6);
                    local_130.m_lastSeparator = (undefined2)local_228.d.size;
                    local_130.m_firstDotInFileName = local_228.d.size._2_2_;
                    local_130.m_lastDotInFileName = local_228.d.size._4_2_;
                    local_130._54_2_ = local_228.d.size._6_2_;
                    local_228.d.size = qVar5;
                    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
                              (&local_1c0,
                               (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                               &local_130);
                    QFileDevicePrivate::setError
                              ((QFileDevicePrivate *)this_00,RenameError,&local_1c0);
                    if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1c0.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                              ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                               &local_130);
                    if (&(local_228.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_228.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_288.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_258.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_270.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_270.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_270.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_270.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_240.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_240.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_240.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1d8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_208.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_1f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1f0.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1f0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    iVar15 = 1;
                    pQVar13 = (QString *)0x0;
                  }
                }
              }
              uVar11 = (uint)pQVar13;
              if ((QArrayData *)local_f8._24_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_f8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_f8._24_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_f8._24_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_f8._24_8_,1,0x10);
                }
              }
              if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                }
              }
              if (iVar15 != 4) goto LAB_002365ad;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
            iVar15 = 2;
LAB_002365ad:
            if (iVar15 == 2) {
              QMetaObject::tr(&local_130.m_filePath,&staticMetaObject,"Error while renaming: %1",
                              (char *)0x0,-1);
              QSystemError::string(&local_1c0,local_1a0.errorScope,local_1a0.errorCode);
              a_00.m_size = local_1c0.d.size | 0x8000000000000000;
              a_00.field_0.m_data_utf16 = local_1c0.d.ptr;
              QString::arg_impl((QString *)local_f8,&local_130.m_filePath,a_00,0,(QChar)0x20);
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_f8);
              if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                }
              }
              if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_130.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_130.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_130.m_filePath.d.d)->super_QArrayData,2,0x10);
                }
              }
              uVar11 = 0;
            }
            if ((QArrayData *)local_b8._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_b8._24_8_,1,0x10);
              }
            }
            if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
              }
            }
            if (&(local_198.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_198.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_198.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_198.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_198.path.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
          else {
            QMetaObject::tr((QString *)local_b8,&staticMetaObject,"Destination file exists",
                            (char *)0x0,-1);
            QFileDevicePrivate::setError
                      ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_b8);
            if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
              }
            }
            uVar11 = 0;
          }
          piVar3 = (int *)CONCAT44(local_168.d.d._4_4_,local_168.d.d._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_168.d.d._4_4_,local_168.d.d._0_4_),1,0x10);
            }
          }
        }
LAB_00235f75:
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,1,0x10);
          }
        }
        goto LAB_00235fa8;
      }
      QMetaObject::tr(&local_78.m_filePath,&staticMetaObject,"Source file does not exist.",
                      (char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,&local_78.m_filePath);
    }
    if ((QFileSystemEntry *)local_78.m_filePath.d.d != (QFileSystemEntry *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_78.m_filePath.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  uVar11 = 0;
LAB_00235fa8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar11 & 0xffffff01;
}

Assistant:

bool
QFile::rename(const QString &newName)
{
    Q_D(QFile);

    // if this is a QTemporaryFile, the virtual fileName() call here may do something
    if (fileName().isEmpty()) {
        qWarning("QFile::rename: Empty or null file name");
        return false;
    }
    if (d->fileName == newName) {
        d->setError(QFile::RenameError, tr("Destination file is the same file."));
        return false;
    }
    if (!exists()) {
        d->setError(QFile::RenameError, tr("Source file does not exist."));
        return false;
    }

    // If the file exists and it is a case-changing rename ("foo" -> "Foo"),
    // compare Ids to make sure it really is a different file.
    // Note: this does not take file engines into account.
    bool changingCase = false;
    QByteArray targetId = QFileSystemEngine::id(QFileSystemEntry(newName));
    if (!targetId.isNull()) {
        QByteArray fileId = d->fileEngine ?
                    d->fileEngine->id() :
                    QFileSystemEngine::id(QFileSystemEntry(d->fileName));
        changingCase = (fileId == targetId && d->fileName.compare(newName, Qt::CaseInsensitive) == 0);
        if (!changingCase) {
            d->setError(QFile::RenameError, tr("Destination file exists"));
            return false;
        }

#if defined(Q_OS_LINUX) && QT_CONFIG(temporaryfile)
        // rename() on Linux simply does nothing when renaming "foo" to "Foo" on a case-insensitive
        // FS, such as FAT32. Move the file away and rename in 2 steps to work around.
        QTemporaryFileName tfn(d->fileName);
        QFileSystemEntry src(d->fileName);
        QSystemError error;
        for (int attempt = 0; attempt < 16; ++attempt) {
            QFileSystemEntry tmp(tfn.generateNext(), QFileSystemEntry::FromNativePath());

            // rename to temporary name
            if (!QFileSystemEngine::renameFile(src, tmp, error))
                continue;

            // rename to final name
            if (QFileSystemEngine::renameFile(tmp, QFileSystemEntry(newName), error)) {
                d->fileEngine->setFileName(newName);
                d->fileName = newName;
                return true;
            }

            // We need to restore the original file.
            QSystemError error2;
            if (QFileSystemEngine::renameFile(tmp, src, error2))
                break;      // report the original error, below

            // report both errors
            d->setError(QFile::RenameError,
                        tr("Error while renaming: %1").arg(error.toString())
                        + u'\n'
                        + tr("Unable to restore from %1: %2").
                        arg(QDir::toNativeSeparators(tmp.filePath()), error2.toString()));
            return false;
        }
        d->setError(QFile::RenameError,
                    tr("Error while renaming: %1").arg(error.toString()));
        return false;
#endif // Q_OS_LINUX
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (changingCase ? d->engine()->renameOverwrite(newName) : d->engine()->rename(newName)) {
            unsetError();
            // engine was able to handle the new name so we just reset it
            d->fileEngine->setFileName(newName);
            d->fileName = newName;
            return true;
        }

        // Engine was unable to rename and the fallback will delete the original file,
        // so we have to back out here on case-insensitive file systems:
        if (changingCase) {
            d->setError(QFile::RenameError, d->fileEngine->errorString());
            return false;
        }

        if (isSequential()) {
            d->setError(QFile::RenameError, tr("Will not rename sequential file using block copy"));
            return false;
        }

#if QT_CONFIG(temporaryfile)
        // copy the file to the destination first
        if (d->copy(newName)) {
            // succeeded, remove the original
            if (!remove()) {
                d->setError(QFile::RenameError, tr("Cannot remove source file: %1").arg(errorString()));
                QFile out(newName);
                // set it back to writable so we can delete it
                out.setPermissions(ReadUser | WriteUser);
                out.remove(newName);
                return false;
            }
            d->fileEngine->setFileName(newName);
            unsetError();
            setFileName(newName);
            return true;
        } else {
            // change the error type but keep the string
            d->setError(QFile::RenameError, errorString());
        }
#else
        // copy the error from the engine rename() above
        d->setError(QFile::RenameError, d->fileEngine->errorString());
#endif
    }
    return false;
}